

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O2

bool __thiscall QLayoutPrivate::checkLayout(QLayoutPrivate *this,QLayout *otherLayout)

{
  QLayout *pQVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_68;
  char local_50 [24];
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QLayout **)&this->field_0x8;
  if (otherLayout == (QLayout *)0x0) {
    local_50[0] = '\x02';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    local_50[0x14] = '\0';
    local_50[0x15] = '\0';
    local_50[0x16] = '\0';
    local_50[0x17] = '\0';
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    local_50[8] = '\0';
    local_50[9] = '\0';
    local_50[10] = '\0';
    local_50[0xb] = '\0';
    local_50[0xc] = '\0';
    local_50[0xd] = '\0';
    local_50[0xe] = '\0';
    local_50[0xf] = '\0';
    local_50[0x10] = '\0';
    local_50[0x11] = '\0';
    local_50[0x12] = '\0';
    local_50[0x13] = '\0';
    local_38 = "default";
    (*(code *)**(undefined8 **)pQVar1)(pQVar1);
    uVar2 = QMetaObject::className();
    QObject::objectName();
    uVar3 = QString::utf16();
    pcVar5 = "QLayout: Cannot add a null layout to %s/%ls";
  }
  else {
    bVar4 = true;
    if (pQVar1 != otherLayout) goto LAB_002e4079;
    local_50[0] = '\x02';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    local_50[0x14] = '\0';
    local_50[0x15] = '\0';
    local_50[0x16] = '\0';
    local_50[0x17] = '\0';
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    local_50[8] = '\0';
    local_50[9] = '\0';
    local_50[10] = '\0';
    local_50[0xb] = '\0';
    local_50[0xc] = '\0';
    local_50[0xd] = '\0';
    local_50[0xe] = '\0';
    local_50[0xf] = '\0';
    local_50[0x10] = '\0';
    local_50[0x11] = '\0';
    local_50[0x12] = '\0';
    local_50[0x13] = '\0';
    local_38 = "default";
    (*(code *)**(undefined8 **)pQVar1)(pQVar1);
    uVar2 = QMetaObject::className();
    QObject::objectName();
    uVar3 = QString::utf16();
    pcVar5 = "QLayout: Cannot add layout %s/%ls to itself";
  }
  bVar4 = false;
  QMessageLogger::warning(local_50,pcVar5,uVar2,uVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
LAB_002e4079:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QLayoutPrivate::checkLayout(QLayout *otherLayout) const
{
    Q_Q(const QLayout);
    if (Q_UNLIKELY(!otherLayout)) {
        qWarning("QLayout: Cannot add a null layout to %s/%ls",
                 q->metaObject()->className(), qUtf16Printable(q->objectName()));
        return false;
    }
    if (Q_UNLIKELY(otherLayout == q)) {
        qWarning("QLayout: Cannot add layout %s/%ls to itself",
                 q->metaObject()->className(), qUtf16Printable(q->objectName()));
        return false;
    }
    return true;
}